

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzP::ChNodeFEAxyzP(ChNodeFEAxyzP *this,ChNodeFEAxyzP *other)

{
  undefined1 *this_00;
  double dVar1;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0xb8);
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb2d338;
  *(undefined8 *)&this->field_0xb8 = 0xb2d438;
  (this->super_ChNodeFEAbase).m_TotalMass = (other->super_ChNodeFEAbase).m_TotalMass;
  (this->super_ChNodeFEAbase).g_index = (other->super_ChNodeFEAbase).g_index;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb2d0b0;
  *(undefined8 *)&this->field_0xb8 = 0xb2d248;
  ChVariablesGeneric::ChVariablesGeneric((ChVariablesGeneric *)this_00,1);
  (this->pos).m_data[2] = 0.0;
  (this->pos).m_data[0] = 0.0;
  (this->pos).m_data[1] = 0.0;
  if (other != this) {
    (this->pos).m_data[0] = (other->pos).m_data[0];
    (this->pos).m_data[1] = (other->pos).m_data[1];
    (this->pos).m_data[2] = (other->pos).m_data[2];
  }
  dVar1 = other->P_dt;
  this->P = other->P;
  this->P_dt = dVar1;
  this->F = other->F;
  ChVariablesGeneric::operator=
            ((ChVariablesGeneric *)this_00,
             (ChVariablesGeneric *)&(other->super_ChNodeFEAbase).field_0x18);
  return;
}

Assistant:

ChNodeFEAxyzP::ChNodeFEAxyzP(const ChNodeFEAxyzP& other) : ChNodeFEAbase(other) {
    pos = other.pos;
    P = other.P;
    P_dt = other.P_dt;
    F = other.F;
    variables = other.variables;
}